

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterCommon.h
# Opt level: O0

void PixelToaster::magical_strcpy<256>(char (*dest) [256],char *src)

{
  uint local_1c;
  uint i;
  char *src_local;
  char (*dest_local) [256];
  
  for (local_1c = 0; (local_1c < 0xff && (src[local_1c] != '\0')); local_1c = local_1c + 1) {
    (*dest)[local_1c] = src[local_1c];
  }
  (*dest)[local_1c] = '\0';
  return;
}

Assistant:

inline void magical_strcpy(char (&dest)[n], const char src[])
{
    unsigned int i = 0;
    while (i < n - 1)
    {
        if (src[i] == 0)
            break;
        dest[i] = src[i];
        i++;
    }
    dest[i] = 0;
}